

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O2

bool __thiscall GF2::VSubst<8UL>::IsBijection(VSubst<8UL> *this)

{
  size_t sVar1;
  word x;
  long lVar2;
  BFunc<8UL> flags;
  bool local_111;
  Func<8UL,_bool> local_110;
  
  BFunc<8UL>::BFunc((BFunc<8UL> *)&local_110,false);
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    local_110._vals
    [(this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[lVar2]._words[0]] = true;
  }
  local_111 = false;
  sVar1 = Func<8UL,_bool>::Count(&local_110,&local_111);
  return sVar1 == 0;
}

Assistant:

bool IsBijection() const
	{	
		BFunc<_n> flags;
		for (word x = 0; x < _size; x++)
			flags[Get(x)] = true;
		return flags.Count(0) == 0;
	}